

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::Connection::PendingQuery
          (Connection *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,vector<duckdb::Value,_true> *values,bool allow_stream_result)

{
  ClientContext *statement_00;
  undefined7 in_register_00000009;
  case_insensitive_map_t<BoundParameterData> named_params;
  undefined1 local_60 [64];
  
  ConvertParamListToMap_abi_cxx11_
            ((case_insensitive_map_t<BoundParameterData> *)(local_60 + 8),
             (duckdb *)CONCAT71(in_register_00000009,allow_stream_result),values);
  statement_00 = shared_ptr<duckdb::ClientContext,_true>::operator->
                           ((shared_ptr<duckdb::ClientContext,_true> *)statement);
  local_60._0_8_ =
       (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
       super__Vector_impl_data._M_start;
  (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ClientContext::PendingQuery
            ((ClientContext *)this,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             statement_00,(case_insensitive_map_t<BoundParameterData> *)local_60,
             (bool)((char)local_60 + '\b'));
  if ((pointer)local_60._0_8_ != (pointer)0x0) {
    (**(code **)(*(long *)(LogicalType *)local_60._0_8_ + 8))();
  }
  local_60._0_8_ = (__buckets_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_60 + 8));
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         this;
}

Assistant:

unique_ptr<PendingQueryResult> Connection::PendingQuery(unique_ptr<SQLStatement> statement, vector<Value> &values,
                                                        bool allow_stream_result) {
	auto named_params = ConvertParamListToMap(values);
	return context->PendingQuery(std::move(statement), named_params, allow_stream_result);
}